

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMatterMeshless::VariablesFbLoadForces(ChMatterMeshless *this,double factor)

{
  double dVar1;
  ChMatrix33<double> *dst;
  ChMatrix33<double> *this_00;
  long *plVar3;
  undefined1 (*pauVar4) [32];
  undefined1 auVar5 [16];
  ChSystem *pCVar6;
  pointer psVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  byte bVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double *pdVar26;
  double *pdVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined *puVar31;
  undefined *puVar32;
  undefined *puVar33;
  long lVar34;
  undefined8 extraout_RAX;
  pointer psVar35;
  uint uVar36;
  ActualDstType actualDst;
  ChStrainTensor<double> *pCVar37;
  ulong uVar38;
  uint uVar39;
  undefined1 this_01 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var40;
  uint uVar41;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var42;
  pointer psVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> M_tmp;
  SrcEvaluatorType srcEvaluator;
  ChStrainTensor<double> strainplasticflow;
  ChStrainTensor<double> proj_e_strain;
  assign_op<double,_double> local_2e9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e0;
  uint local_2d4;
  ChMatterMeshless *local_2d0;
  ChMatrix33<double> *local_2c8;
  plainobjectbase_evaluator_data<double,_3> local_2c0;
  ChMatrix33<double> local_2b8;
  undefined1 local_270 [16];
  double dStack_260;
  double dStack_258;
  double dStack_250;
  double dStack_248;
  double dStack_240;
  double dStack_238;
  double dStack_230;
  SrcEvaluatorType SStack_228;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_1b8;
  DstXprType local_198;
  double local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined1 local_108 [8];
  undefined1 auStack_100 [16];
  double dStack_f0;
  ChStrainTensor<double> local_c8;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  double dVar2;
  
  pCVar6 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
  psVar43 = (pCVar6->assembly).otherphysicslist.
            super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (pCVar6->assembly).otherphysicslist.
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_148 = factor;
  if (psVar43 != psVar7) {
    p_Var40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      peVar8 = (psVar43->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var9 = (psVar43->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
      }
      if (peVar8 == (element_type *)0x0) {
        auVar49._56_8_ = 0;
        auVar49._0_56_ = _auStack_100;
        _local_108 = auVar49 << 0x40;
        p_Var42 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        lVar34 = __dynamic_cast(peVar8,&ChPhysicsItem::typeinfo,
                                &ChProximityContainerMeshless::typeinfo,0);
        local_108 = (undefined1  [8])lVar34;
        if (lVar34 == 0 || p_Var9 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var42 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          p_Var42 = p_Var9;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          }
        }
      }
      if (p_Var40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var40);
      }
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
      puVar33 = DAT_00b689a8;
      puVar32 = DAT_00b689a0;
      puVar31 = VNULL;
      this_01 = local_108;
      if (local_108 != (undefined1  [8])0x0) {
        psVar35 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar34 = (long)(this->nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar35;
        if (lVar34 != 0) {
          uVar41 = 1;
          uVar44 = 0;
          do {
            peVar10 = psVar35[uVar44].
                      super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
                 0.0;
            (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
                 0.0;
            (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
                 0.0;
            (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
                 0.0;
            *(undefined **)&(peVar10->t_strain).super_ChVoightTensor<double> = (undefined *)0x0;
            (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
                 0.0;
            (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
                 0.0;
            (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
                 0.0;
            *(undefined **)&(peVar10->e_stress).super_ChVoightTensor<double> = (undefined *)0x0;
            (peVar10->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
                 0.0;
            (peVar10->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
                 0.0;
            (peVar10->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
                 0.0;
            (peVar10->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
                 0.0;
            (peVar10->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
                 0.0;
            (peVar10->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
                 0.0;
            (peVar10->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
                 0.0;
            (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
                 0.0;
            *(undefined **)&(peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3> = (undefined *)0x0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
                 0.0;
            *(undefined **)&(peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3> =
                 (undefined *)0x0;
            (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
                 0.0;
            (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
                 0.0;
            (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
                 0.0;
            (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
                 0.0;
            (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
                 0.0;
            (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
                 0.0;
            (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
                 0.0;
            (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
                 0.0;
            if (peVar10 != (element_type *)&PTR_typeinfo_00b68718) {
              (peVar10->UserForce).m_data[0] = (double)puVar31;
              (peVar10->UserForce).m_data[1] = (double)puVar32;
              (peVar10->UserForce).m_data[2] = (double)puVar33;
            }
            peVar10->density = 0.0;
            uVar44 = (ulong)uVar41;
            uVar41 = uVar41 + 1;
          } while (uVar44 < (ulong)(lVar34 >> 4));
        }
        local_2e0 = p_Var42;
        ChProximityContainerMeshless::AccumulateStep1((ChProximityContainerMeshless *)local_108);
        psVar35 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != psVar35) {
          uVar41 = 1;
          uVar44 = 0;
          auVar47 = vpbroadcastq_avx512vl();
          local_58 = vpaddq_avx2(auVar47,_DAT_0096e8a0);
          local_78 = vpaddq_avx2(auVar47,_DAT_0096e8c0);
          local_98 = vpaddq_avx2(auVar47,_DAT_0096e8e0);
          local_2d0 = this;
          do {
            peVar10 = psVar35[uVar44].
                      super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            p_Var40 = psVar35[uVar44].
                      super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            if (p_Var40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var40->_M_use_count = p_Var40->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var40->_M_use_count = p_Var40->_M_use_count + 1;
              }
            }
            if (peVar10 == (element_type *)0x0) {
              __assert_fail("mnode",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                            ,0x1ef,
                            "virtual void chrono::fea::ChMatterMeshless::VariablesFbLoadForces(double)"
                           );
            }
            dVar53 = 0.0;
            if (0.0 < peVar10->density) {
              dVar53 = (double)(**(code **)((long)(peVar10->super_ChNodeXYZ).super_ChLoadableUVW +
                                           0x90))(peVar10);
              dVar53 = dVar53 / peVar10->density;
            }
            peVar10->volume = dVar53;
            dst = &peVar10->Amoment;
            local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
                 (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            pdVar26 = (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 1;
            local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
                 *pdVar26;
            local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
                 (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
                 (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
            pdVar27 = (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 4;
            local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
                 *pdVar27;
            local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
                 (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
            auVar25 = *(undefined1 (*) [16])pdVar27;
            local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
                 (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            pdVar27 = (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 7;
            local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
                 *pdVar27;
            local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
                 (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar24._8_8_ =
                 local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            auVar24._0_8_ =
                 local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            auVar45 = vmulpd_avx512vl(auVar25,auVar24);
            auVar46._8_8_ =
                 local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
            auVar46._0_8_ =
                 local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
            auVar46 = vfmsub231pd_avx512vl(auVar45,*(undefined1 (*) [16])pdVar27,auVar46);
            auVar45._8_8_ = 0;
            auVar45._0_8_ =
                 local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar58._8_8_ = 0;
            auVar58._0_8_ =
                 local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7] * local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5];
            auVar24 = vfmsub132sd_fma(auVar25,auVar58,auVar45);
            auVar45 = vpermilpd_avx(*(undefined1 (*) [16])pdVar26,1);
            auVar57._0_8_ = auVar45._0_8_ * auVar46._0_8_;
            auVar57._8_8_ = auVar45._8_8_ * auVar46._8_8_;
            auVar45 = vshufpd_avx(auVar57,auVar57,1);
            auVar25._8_8_ = 0x7fffffffffffffff;
            auVar25._0_8_ = 0x7fffffffffffffff;
            auVar54._8_8_ = 0;
            auVar54._0_8_ =
                 auVar57._0_8_ +
                 (auVar24._0_8_ *
                  local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0] - auVar45._0_8_);
            auVar45 = vandpd_avx512vl(auVar54,auVar25);
            if (3e-05 <= auVar45._0_8_) {
              local_2e8 = p_Var40;
              local_2d4 = uVar41;
              SStack_228.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array[0] = (double)&local_2b8;
              Eigen::internal::
              Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
              ::run(&dst->super_Matrix<double,_3,_3,_1,_3,_3>,(SrcXprType *)&SStack_228,
                    (assign_op<double,_double> *)&local_198);
              this_00 = &peVar10->J;
              local_2c8 = dst;
              SStack_228.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array[0] = (double)dst;
              SStack_228.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array[1] = (double)this_00;
              ChMatrix33<double>::operator=
                        (&local_2b8,
                         (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                          *)&SStack_228);
              local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
                   = local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0] + 1.0;
              local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
                   = local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4] + 1.0;
              local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
                   = local_2b8.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8] + 1.0;
              SStack_228.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array[0] = (double)&local_2b8;
              ChMatrix33<double>::operator=
                        (this_00,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                  *)&SStack_228);
              SStack_228.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array[0] = (double)&local_2b8;
              SStack_228.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array[1] = (double)this_00;
              ChMatrix33<double>::
              ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                        ((ChMatrix33<double> *)local_270,
                         (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                          *)&SStack_228);
              auVar49 = stack0xfffffffffffffd98;
              this = local_2d0;
              local_270._0_8_ = (double)local_270._0_8_ + -1.0;
              dVar53 = dStack_250 + -1.0;
              dStack_250 = dVar53;
              auVar50 = stack0xfffffffffffffd98;
              dStack_230 = auVar49._56_8_;
              dStack_230 = dStack_230 + -1.0;
              stack0xfffffffffffffd98 = auVar50._0_56_;
              auVar50 = stack0xfffffffffffffd98;
              (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
                   = local_270._0_8_;
              (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
                   = dVar53;
              (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
                   = dStack_230;
              local_270._8_8_ = auVar49._0_8_;
              dStack_260 = auVar49._8_8_;
              (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
                   = (double)local_270._8_8_;
              (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
                   = dStack_260;
              dStack_248 = auVar49._32_8_;
              (peVar10->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
                   = dStack_248;
              uStack_118 = 0;
              uStack_110 = 0;
              local_138 = 0;
              uStack_130 = 0;
              local_128 = 0;
              uStack_120 = 0;
              peVar11 = (local_2d0->material).
                        super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              peVar12 = (local_2d0->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar44].
                        super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
              pCVar37 = &peVar12->e_strain;
              unique0x1000530e = auVar50;
              (*(peVar11->super_ChContinuumElastic).super_ChContinuumMaterial.
                _vptr_ChContinuumMaterial[6])
                        (peVar11,&local_138,&peVar12->t_strain,pCVar37,&peVar12->p_strain);
              uVar41 = local_2d4;
              p_Var40 = local_2e8;
              this_01 = local_108;
              peVar12 = (this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar44].
                        super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
              auVar28._8_8_ = uStack_130;
              auVar28._0_8_ = local_138;
              auVar45 = vsubpd_avx(*(undefined1 (*) [16])
                                    &(peVar12->e_strain).super_ChVoightTensor<double>,auVar28);
              local_c8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
                   = auVar45._0_8_ + *(double *)&(peVar12->t_strain).super_ChVoightTensor<double>;
              local_c8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
                   = auVar45._8_8_ +
                     (peVar12->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[1];
              auVar29._8_8_ = uStack_120;
              auVar29._0_8_ = local_128;
              auVar45 = vsubpd_avx(*(undefined1 (*) [16])
                                    ((peVar12->e_strain).super_ChVoightTensor<double>.
                                     super_ChVectorN<double,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array + 2),auVar29);
              local_c8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
                   = auVar45._0_8_ +
                     (peVar12->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[2];
              local_c8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
                   = auVar45._8_8_ +
                     (peVar12->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[3];
              auVar30._8_8_ = uStack_110;
              auVar30._0_8_ = uStack_118;
              auVar45 = vsubpd_avx(*(undefined1 (*) [16])
                                    ((peVar12->e_strain).super_ChVoightTensor<double>.
                                     super_ChVectorN<double,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                     m_storage.m_data.array + 4),auVar30);
              local_c8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
                   = auVar45._0_8_ +
                     (peVar12->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[4];
              local_c8.super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
                   = auVar45._8_8_ +
                     (peVar12->t_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[5];
              ChContinuumElastic::ComputeElasticStress
                        (&((this->material).
                           super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->super_ChContinuumElastic,&peVar10->e_stress,&local_c8);
              local_270._0_8_ =
                   (peVar10->e_stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array[0];
              local_1b8.m_dst = (DstEvaluatorType *)&local_2c0;
              local_2c0.data = (double *)&local_198;
              register0x000008fc =
                   vgatherdpd_avx512f(*(undefined4 *)
                                       ((long)(peVar10->super_ChNodeXYZ).pos.m_data +
                                       (long)(pCVar37[0xffffffffffffffff].
                                              super_ChVoightTensor<double>.
                                              super_ChVectorN<double,_6>.
                                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                              .m_storage.m_data.array + 5)));
              uVar44 = CONCAT71((int7)((ulong)extraout_RAX >> 8),7) & 0xffffffff;
              dVar1 = (double)((ulong)((byte)uVar44 & 1) * (long)dStack_240);
              dVar2 = (double)((ulong)((byte)(uVar44 >> 1) & 1) * (long)dStack_238);
              dVar53 = (double)((ulong)((byte)(uVar44 >> 2) & 1) * (long)dStack_230);
              SStack_228.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhsImpl.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
              data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>)
                     &SStack_228;
              dVar15 = peVar10->volume + peVar10->volume;
              dVar16 = dVar15 * (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[2];
              dVar17 = dVar15 * (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[1];
              dVar18 = dVar15 * (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[8];
              dVar19 = dVar15 * (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[7];
              dVar20 = dVar15 * (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[6];
              dVar21 = dVar15 * (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[5];
              dVar22 = dVar15 * (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[4];
              dVar23 = dVar15 * (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[3];
              dVar15 = dVar15 * (peVar10->J).super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0];
              auVar47._0_8_ =
                   (double)local_270._0_8_ * dVar15 + dVar17 * dStack_258 + dVar1 * dVar16;
              auVar47._8_8_ =
                   (double)local_270._8_8_ * dVar15 + dVar17 * dStack_250 + dVar2 * dVar16;
              auVar47._16_8_ = dStack_260 * dVar15 + dVar17 * dStack_248 + dVar53 * dVar16;
              auVar47._24_8_ = dStack_258 * dVar15 + dVar17 * dStack_240 + dVar16 * 0.0;
              vscatterqpd_avx512vl(ZEXT832(0) + local_58,uVar44,auVar47);
              auVar55._0_8_ =
                   (double)local_270._0_8_ * dVar23 + dStack_258 * dVar22 + dVar1 * dVar21;
              auVar55._8_8_ =
                   (double)local_270._8_8_ * dVar23 + dStack_250 * dVar22 + dVar2 * dVar21;
              auVar55._16_8_ = dStack_260 * dVar23 + dStack_248 * dVar22 + dVar53 * dVar21;
              auVar55._24_8_ = dStack_258 * dVar23 + dStack_240 * dVar22 + dVar21 * 0.0;
              vscatterqpd_avx512vl(ZEXT832(0) + local_78,uVar44,auVar55);
              auVar56._0_8_ =
                   (double)local_270._0_8_ * dVar20 + dStack_258 * dVar19 + dVar1 * dVar18;
              auVar56._8_8_ =
                   (double)local_270._8_8_ * dVar20 + dStack_250 * dVar19 + dVar2 * dVar18;
              auVar56._16_8_ = dStack_260 * dVar20 + dStack_248 * dVar19 + dVar53 * dVar18;
              auVar56._24_8_ = dStack_258 * dVar20 + dStack_240 * dVar19 + dVar18 * 0.0;
              vscatterqpd_avx512vl(ZEXT832(0) + local_98,uVar44,auVar56);
              SStack_228.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_rhs = &local_2c8->super_Matrix<double,_3,_3,_1,_3,_3>;
              local_1b8.m_functor = &local_2e9;
              SStack_228.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_rhsImpl.
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
                     (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
                     local_2c8;
              SStack_228.
              super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_innerDim = 3;
              local_1b8.m_src =
                   (SrcEvaluatorType *)
                   SStack_228.
                   super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                   .m_lhsImpl.
                   super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.
                   m_d.data;
              local_1b8.m_dstExpr = (DstXprType *)local_2c0.data;
              Eigen::internal::
              copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
              ::run(&local_1b8);
              (peVar10->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
                   = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[0];
              (peVar10->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
                   = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[1];
              (peVar10->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
                   = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[2];
              (peVar10->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
                   = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[3];
              (peVar10->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
                   = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[4];
              (peVar10->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
                   = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[5];
              (peVar10->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
                   = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[6];
              (peVar10->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
                   = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[7];
              (peVar10->FA).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
                   = local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[8];
            }
            else {
              (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
                   = 0.0;
              (dst->super_Matrix<double,_3,_3,_1,_3,_3>).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
                   = 0.0;
              (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
                   = 0.0;
              (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
                   = 0.0;
              (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
                   = 0.0;
              (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
                   = 0.0;
              (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
                   = 0.0;
              (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
                   = 0.0;
              (peVar10->Amoment).super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
                   = 0.0;
              (peVar10->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
                   = 0.0;
              (peVar10->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
                   = 0.0;
              (peVar10->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
                   = 0.0;
              (peVar10->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
                   = 0.0;
              (peVar10->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
                   = 0;
              (peVar10->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
                   = 0.0;
              (peVar10->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2]
                   = 0.0;
              (peVar10->e_strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
                   = 0.0;
            }
            if (p_Var40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var40);
            }
            psVar35 = (this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar44 = (ulong)uVar41;
            uVar41 = uVar41 + 1;
          } while (uVar44 < (ulong)((long)(this->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar35
                                   >> 4));
        }
        ChProximityContainerMeshless::AccumulateStep2((ChProximityContainerMeshless *)this_01);
        psVar35 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var40 = local_2e0;
        if ((this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == psVar35) goto LAB_006161e3;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_148;
        _local_108 = vbroadcastsd_avx512f(auVar5);
        uVar41 = 1;
        uVar44 = 0;
        do {
          pCVar6 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
          dVar53 = (double)(**(code **)((long)((psVar35[uVar44].
                                                super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->super_ChNodeXYZ).super_ChLoadableUVW + 0x90
                                       ))();
          p_Var40 = local_2e0;
          psVar35 = (this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          peVar10 = psVar35[uVar44].
                    super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          SStack_228.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [0] = dVar53 * (pCVar6->G_acc).m_data[0] + (peVar10->UserForce).m_data[0];
          SStack_228.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [1] = dVar53 * (pCVar6->G_acc).m_data[1] + (peVar10->UserForce).m_data[1];
          SStack_228.
          super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
          .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [2] = dVar53 * (pCVar6->G_acc).m_data[2] + (peVar10->UserForce).m_data[2];
          p_Var9 = psVar35[uVar44].
                   super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            }
          }
          ChVariables::Get_fb((ChVectorRef *)&local_198,&(peVar10->variables).super_ChVariables);
          if (local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[1] != 1.48219693752374e-323) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 3, 1>>, const Eigen::Map<Eigen::Matrix<double, 3, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                         );
          }
          uVar36 = 3;
          if (((ulong)local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array[0] & 7) == 0) {
            uVar39 = -((uint)((ulong)local_198.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                     m_storage.m_data.array[0] >> 3) & 0x1fffffff) & 7;
            if (uVar39 < 3) {
              uVar36 = uVar39;
            }
            if (uVar39 != 0) goto LAB_0061612e;
          }
          else {
LAB_0061612e:
            auVar49 = vpbroadcastq_avx512f();
            uVar44 = vpcmpuq_avx512f(auVar49,_DAT_0096ea00,5);
            bVar13 = (byte)uVar44;
            auVar50._8_8_ =
                 (ulong)((byte)(uVar44 >> 1) & 1) *
                 (long)SStack_228.
                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                       .m_data.array[1];
            auVar50._0_8_ =
                 (ulong)(bVar13 & 1) *
                 (long)SStack_228.
                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                       .m_data.array[0];
            auVar50._16_8_ =
                 (ulong)((byte)(uVar44 >> 2) & 1) *
                 (long)SStack_228.
                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                       .m_data.array[2];
            auVar50._24_8_ =
                 (ulong)((byte)(uVar44 >> 3) & 1) *
                 (long)SStack_228.
                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                       .m_data.array[3];
            auVar50._32_8_ =
                 (ulong)((byte)(uVar44 >> 4) & 1) *
                 (long)SStack_228.
                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                       .m_data.array[4];
            auVar50._40_8_ =
                 (ulong)((byte)(uVar44 >> 5) & 1) *
                 (long)SStack_228.
                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                       .m_data.array[5];
            auVar50._48_8_ =
                 (ulong)((byte)(uVar44 >> 6) & 1) *
                 (long)SStack_228.
                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                       .m_data.array[6];
            auVar50._56_8_ =
                 (uVar44 >> 7) *
                 (long)SStack_228.
                       super_product_evaluator<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                       .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                       .m_data.array[7];
            auVar51._8_8_ =
                 (ulong)((byte)(uVar44 >> 1) & 1) *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 8);
            auVar51._0_8_ =
                 (ulong)(bVar13 & 1) *
                 *(long *)(undefined1 *)
                          local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array[0];
            auVar51._16_8_ =
                 (ulong)((byte)(uVar44 >> 2) & 1) *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x10);
            auVar51._24_8_ =
                 (ulong)((byte)(uVar44 >> 3) & 1) *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x18);
            auVar51._32_8_ =
                 (ulong)((byte)(uVar44 >> 4) & 1) *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x20);
            auVar51._40_8_ =
                 (ulong)((byte)(uVar44 >> 5) & 1) *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x28);
            auVar51._48_8_ =
                 (ulong)((byte)(uVar44 >> 6) & 1) *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x30);
            auVar51._56_8_ =
                 (uVar44 >> 7) *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x38);
            auVar49 = vmulpd_avx512f(auVar50,_local_108);
            auVar49 = vaddpd_avx512f(auVar49,auVar51);
            auVar52._0_8_ =
                 (ulong)(bVar13 & 1) * auVar49._0_8_ |
                 (ulong)!(bool)(bVar13 & 1) *
                 *(long *)(undefined1 *)
                          local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                          m_storage.m_data.array[0];
            bVar14 = (bool)((byte)(uVar44 >> 1) & 1);
            auVar52._8_8_ =
                 (ulong)bVar14 * auVar49._8_8_ |
                 (ulong)!bVar14 *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 8);
            bVar14 = (bool)((byte)(uVar44 >> 2) & 1);
            auVar52._16_8_ =
                 (ulong)bVar14 * auVar49._16_8_ |
                 (ulong)!bVar14 *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x10);
            bVar14 = (bool)((byte)(uVar44 >> 3) & 1);
            auVar52._24_8_ =
                 (ulong)bVar14 * auVar49._24_8_ |
                 (ulong)!bVar14 *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x18);
            bVar14 = (bool)((byte)(uVar44 >> 4) & 1);
            auVar52._32_8_ =
                 (ulong)bVar14 * auVar49._32_8_ |
                 (ulong)!bVar14 *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x20);
            bVar14 = (bool)((byte)(uVar44 >> 5) & 1);
            auVar52._40_8_ =
                 (ulong)bVar14 * auVar49._40_8_ |
                 (ulong)!bVar14 *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x28);
            bVar14 = (bool)((byte)(uVar44 >> 6) & 1);
            auVar52._48_8_ =
                 (ulong)bVar14 * auVar49._48_8_ |
                 (ulong)!bVar14 *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x30);
            auVar52._56_8_ =
                 (uVar44 >> 7) * auVar49._56_8_ |
                 (ulong)!SUB81(uVar44 >> 7,0) *
                 *(long *)((undefined1 *)
                           local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                           m_storage.m_data.array[0] + 0x38);
            *(undefined1 (*) [64])
             local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
             .array[0] = auVar52;
          }
          if (uVar36 < 3) {
            uVar38 = (ulong)(uVar36 << 3);
            auVar47 = vpbroadcastq_avx512vl();
            uVar44 = vpcmpuq_avx512vl(auVar47,_DAT_00955380,5);
            uVar44 = uVar44 & 0xf;
            bVar13 = (byte)uVar44;
            plVar3 = (long *)((undefined1 *)
                              local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                              .m_storage.m_data.array[0] + uVar38);
            pauVar4 = (undefined1 (*) [32])
                      ((undefined1 *)
                       local_198.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[0] + uVar38);
            auVar48._0_8_ =
                 (ulong)(bVar13 & 1) *
                 (long)((double)((ulong)(bVar13 & 1) * *(long *)((long)&SStack_228 + uVar38)) *
                        (double)local_108 + (double)((ulong)(bVar13 & 1) * *plVar3)) |
                 (ulong)!(bool)(bVar13 & 1) * *(long *)*pauVar4;
            bVar14 = (bool)((byte)(uVar44 >> 1) & 1);
            auVar48._8_8_ =
                 (ulong)bVar14 *
                 (long)((double)((ulong)((byte)(uVar44 >> 1) & 1) *
                                *(long *)((long)&SStack_228 + uVar38 + 8)) *
                        (double)auStack_100._0_8_ +
                       (double)((ulong)((byte)(uVar44 >> 1) & 1) * plVar3[1])) |
                 (ulong)!bVar14 * *(long *)(*pauVar4 + 8);
            bVar14 = (bool)((byte)(uVar44 >> 2) & 1);
            auVar48._16_8_ =
                 (ulong)bVar14 *
                 (long)((double)((ulong)((byte)(uVar44 >> 2) & 1) *
                                *(long *)((long)&SStack_228 + uVar38 + 0x10)) *
                        (double)auStack_100._8_8_ +
                       (double)((ulong)((byte)(uVar44 >> 2) & 1) * plVar3[2])) |
                 (ulong)!bVar14 * *(long *)(*pauVar4 + 0x10);
            auVar48._24_8_ =
                 (uVar44 >> 3) *
                 (long)((double)((uVar44 >> 3) * *(long *)((long)&SStack_228 + uVar38 + 0x18)) *
                        dStack_f0 + (double)((uVar44 >> 3) * plVar3[3])) |
                 (ulong)!SUB81(uVar44 >> 3,0) * *(long *)(*pauVar4 + 0x18);
            *pauVar4 = auVar48;
          }
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          psVar35 = (this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar44 = (ulong)uVar41;
          uVar41 = uVar41 + 1;
          if ((ulong)((long)(this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar35 >> 4) <=
              uVar44) {
LAB_006161e3:
            if (p_Var40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var40);
            }
            return;
          }
        } while( true );
      }
      psVar43 = psVar43 + 1;
      p_Var40 = p_Var42;
    } while (psVar43 != psVar7);
  }
  __assert_fail("edges",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                ,0x1da,"virtual void chrono::fea::ChMatterMeshless::VariablesFbLoadForces(double)");
}

Assistant:

void ChMatterMeshless::VariablesFbLoadForces(double factor) {
    // COMPUTE THE MESHLESS FORCES HERE

    // First, find if any ChProximityContainerMeshless object is present
    // in the system,

    std::shared_ptr<ChProximityContainerMeshless> edges;
    for (auto otherphysics : GetSystem()->Get_otherphysicslist()) {
        if ((edges = std::dynamic_pointer_cast<ChProximityContainerMeshless>(otherphysics)))
            break;
    }
    assert(edges);  // If using a ChMatterMeshless, you must add also a ChProximityContainerMeshless.

    // 1- Per-node initialization

    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->J.setZero();
        nodes[j]->Amoment.setZero();
        nodes[j]->t_strain.setZero();
        nodes[j]->e_stress.setZero();
        nodes[j]->UserForce = VNULL;
        nodes[j]->density = 0;
    }

    // 2- Per-edge initialization and accumulation of values in particles's J, Amoment, m_v, density

    edges->AccumulateStep1();

    // 3- Per-node inversion of A and computation of strain stress

    for (unsigned int j = 0; j < nodes.size(); j++) {
        std::shared_ptr<ChNodeMeshless> mnode(nodes[j]);
        assert(mnode);

        // node volume is v=mass/density
        if (mnode->density > 0)
            mnode->volume = mnode->GetMass() / mnode->density;
        else
            mnode->volume = 0;

        // Compute A inverse
        ChMatrix33<> M_tmp = mnode->Amoment;

        if (std::abs(M_tmp.determinant()) < 0.00003) {
            mnode->Amoment.setZero();     // deactivate if not possible to invert
            mnode->e_strain.setZero();  // detach
        } else {
            mnode->Amoment = M_tmp.inverse();

            // Compute J = ( A^-1 * [dwg | dwg | dwg] )' + I
            M_tmp = mnode->Amoment * mnode->J;
            M_tmp(0, 0) += 1;
            M_tmp(1, 1) += 1;
            M_tmp(2, 2) += 1;
            mnode->J = M_tmp.transpose();

            // Compute step strain tensor  de = J'*J - I
            ChMatrix33<> mtensor = M_tmp * mnode->J;
            mtensor(0, 0) -= 1;
            mtensor(1, 1) -= 1;
            mtensor(2, 2) -= 1;

            mnode->t_strain.ConvertFromMatrix(mtensor);  // store 'step strain' de, change in total strain

            ChStrainTensor<> strainplasticflow;
            material->ComputeReturnMapping(strainplasticflow,   // dEp, flow of elastic strain (correction)
                                           nodes[j]->t_strain,  // increment of total strain
                                           nodes[j]->e_strain,  // last elastic strain
                                           nodes[j]->p_strain   // last plastic strain
                                           );
            ChStrainTensor<> proj_e_strain = nodes[j]->e_strain - strainplasticflow + nodes[j]->t_strain;
            GetMaterial()->ComputeElasticStress(mnode->e_stress, proj_e_strain);
            mnode->e_stress.ConvertToMatrix(mtensor);

            /*
            // Compute elastic stress tensor  sigma= C*epsilon
            //   NOTE: it should be better to perform stress computation on corrected e_strain, _after_ the
            //   return mapping (see later), but for small timestep it could be the same.
            ChStrainTensor<> guesstot_e_strain; // anticipate the computation of total strain for anticipating strains
            guesstot_e_strain.MatrAdd(mnode->e_strain, mnode->t_strain);
            GetMaterial()->ComputeElasticStress(mnode->e_stress, guesstot_e_strain);
            mnode->e_stress.ConvertToMatrix(mtensor);
            */

            // Precompute 2*v*J*sigma*A^-1
            mnode->FA = (2 * mnode->volume) * mnode->J * mtensor * mnode->Amoment;
        }
    }

    // 4- Per-edge force transfer from stress, and add also viscous forces

    edges->AccumulateStep2();

    // 5- Per-node load force

    for (unsigned int j = 0; j < nodes.size(); j++) {
        // particle gyroscopic force:
        // none.

        // add gravity
        ChVector<> Gforce = GetSystem()->Get_G_acc() * nodes[j]->GetMass();
        ChVector<> TotForce = nodes[j]->UserForce + Gforce;

        std::shared_ptr<ChNodeMeshless> mnode(nodes[j]);
        assert(mnode);

        mnode->variables.Get_fb() += factor * TotForce.eigen();
    }
}